

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_build_transform(ALLEGRO_TRANSFORM *trans,float x,float y,float sx,float sy,float theta)

{
  float fVar1;
  float fVar2;
  
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  *(ulong *)trans->m[0] = CONCAT44(sy * fVar2,sx * fVar1);
  *(float *)((long)(trans->m + 0) + 8) = 0.0;
  *(float *)((long)(trans->m + 0) + 0xc) = 0.0;
  *(ulong *)trans->m[1] = CONCAT44(sy * fVar1,-sx * fVar2);
  *(float *)((long)(trans->m + 1) + 8) = 0.0;
  *(float *)((long)(trans->m + 1) + 0xc) = 0.0;
  *(float *)((long)(trans->m + 2) + 0) = 0.0;
  *(float *)((long)(trans->m + 2) + 4) = 0.0;
  *(float *)((long)(trans->m + 2) + 8) = 1.0;
  *(float *)((long)(trans->m + 2) + 0xc) = 0.0;
  trans->m[3][0] = x;
  trans->m[3][1] = y;
  *(float *)((long)(trans->m + 3) + 8) = 0.0;
  *(float *)((long)(trans->m + 3) + 0xc) = 1.0;
  return;
}

Assistant:

void al_build_transform(ALLEGRO_TRANSFORM *trans, float x, float y,
   float sx, float sy, float theta)
{
   float c, s;
   ASSERT(trans);

   c = cosf(theta);
   s = sinf(theta);

   trans->m[0][0] = sx * c;
   trans->m[0][1] = sy * s;
   trans->m[0][2] = 0;
   trans->m[0][3] = 0;

   trans->m[1][0] = -sx * s;
   trans->m[1][1] = sy * c;
   trans->m[1][2] = 0;
   trans->m[1][3] = 0;

   trans->m[2][0] = 0;
   trans->m[2][1] = 0;
   trans->m[2][2] = 1;
   trans->m[2][3] = 0;

   trans->m[3][0] = x;
   trans->m[3][1] = y;
   trans->m[3][2] = 0;
   trans->m[3][3] = 1;
}